

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::Switch(Switch *this,State st,QWidget *parent)

{
  SwitchPrivate *this_00;
  QSizePolicy local_38 [5];
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  Switch *pSStack_10;
  State st_local;
  Switch *this_local;
  
  local_20 = parent;
  parent_local._4_4_ = st;
  pSStack_10 = this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_00241170;
  *(undefined ***)&this->field_0x10 = &PTR__Switch_00241320;
  this_00 = (SwitchPrivate *)operator_new(0x70);
  SwitchPrivate::SwitchPrivate(this_00,this);
  QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>::
  QScopedPointer(&this->d,this_00);
  QSizePolicy::QSizePolicy(local_38,Fixed,Fixed,DefaultType);
  QWidget::setSizePolicy((QSizePolicy *)this);
  setState(this,parent_local._4_4_);
  return;
}

Assistant:

Switch::Switch( State st, QWidget * parent )
	:	QWidget( parent )
	,	d( new SwitchPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );

	setState( st );
}